

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  int local_ec;
  int local_d8;
  int local_d4;
  undefined1 local_d0 [8];
  Mem c2;
  Mem c1;
  int n2;
  int n1;
  void *v2;
  void *v1;
  double r2;
  double r1;
  int combined_flags;
  int f2;
  int f1;
  int rc;
  CollSeq *pColl_local;
  Mem *pMem2_local;
  Mem *pMem1_local;
  
  uVar1 = pMem1->flags;
  uVar2 = pMem2->flags;
  uVar3 = uVar1 | uVar2;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 0xc) == 0) {
      if ((uVar3 & 2) != 0) {
        if ((uVar1 & 2) == 0) {
          return 1;
        }
        if ((uVar2 & 2) == 0) {
          return -1;
        }
        if (pColl != (CollSeq *)0x0) {
          if (pMem1->enc == pColl->enc) {
            iVar4 = (*pColl->xCmp)(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
            return iVar4;
          }
          memset(&c2.zMalloc,0,0x38);
          memset(local_d0,0,0x38);
          sqlite3VdbeMemShallowCopy((Mem *)&c2.zMalloc,pMem1,0x1000);
          sqlite3VdbeMemShallowCopy((Mem *)local_d0,pMem2,0x1000);
          pvVar5 = sqlite3ValueText((sqlite3_value *)&c2.zMalloc,pColl->enc);
          if (pvVar5 == (void *)0x0) {
            local_d4 = 0;
          }
          else {
            local_d4 = c1.u.nZero;
          }
          pvVar6 = sqlite3ValueText((sqlite3_value *)local_d0,pColl->enc);
          if (pvVar6 == (void *)0x0) {
            local_d8 = 0;
          }
          else {
            local_d8 = c2.u.nZero;
          }
          iVar4 = (*pColl->xCmp)(pColl->pUser,local_d4,pvVar5,local_d8,pvVar6);
          sqlite3VdbeMemRelease((Mem *)&c2.zMalloc);
          sqlite3VdbeMemRelease((Mem *)local_d0);
          return iVar4;
        }
      }
      if (pMem2->n < pMem1->n) {
        local_ec = pMem2->n;
      }
      else {
        local_ec = pMem1->n;
      }
      f2 = memcmp(pMem1->z,pMem2->z,(long)local_ec);
      if (f2 == 0) {
        f2 = pMem1->n - pMem2->n;
      }
      pMem1_local._4_4_ = f2;
    }
    else if ((uVar1 & 0xc) == 0) {
      pMem1_local._4_4_ = 1;
    }
    else if ((uVar2 & 0xc) == 0) {
      pMem1_local._4_4_ = -1;
    }
    else if ((uVar1 & uVar2 & 4) == 0) {
      if ((uVar1 & 8) == 0) {
        r2 = (double)(pMem1->u).i;
      }
      else {
        r2 = pMem1->r;
      }
      if ((uVar2 & 8) == 0) {
        v1 = (void *)(double)(pMem2->u).i;
      }
      else {
        v1 = (void *)pMem2->r;
      }
      if ((double)v1 <= r2) {
        if (r2 <= (double)v1) {
          pMem1_local._4_4_ = 0;
        }
        else {
          pMem1_local._4_4_ = 1;
        }
      }
      else {
        pMem1_local._4_4_ = -1;
      }
    }
    else if ((pMem1->u).i < (pMem2->u).i) {
      pMem1_local._4_4_ = -1;
    }
    else if ((pMem2->u).i < (pMem1->u).i) {
      pMem1_local._4_4_ = 1;
    }
    else {
      pMem1_local._4_4_ = 0;
    }
  }
  else {
    pMem1_local._4_4_ = (uVar2 & 1) - (uVar1 & 1);
  }
  return pMem1_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int rc;
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( (combined_flags & MEM_RowSet)==0 );
 
  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* If one value is a number and the other is not, the number is less.
  ** If both are numbers, compare as reals if one is a real, or as integers
  ** if both values are integers.
  */
  if( combined_flags&(MEM_Int|MEM_Real) ){
    if( !(f1&(MEM_Int|MEM_Real)) ){
      return 1;
    }
    if( !(f2&(MEM_Int|MEM_Real)) ){
      return -1;
    }
    if( (f1 & f2 & MEM_Int)==0 ){
      double r1, r2;
      if( (f1&MEM_Real)==0 ){
        r1 = (double)pMem1->u.i;
      }else{
        r1 = pMem1->r;
      }
      if( (f2&MEM_Real)==0 ){
        r2 = (double)pMem2->u.i;
      }else{
        r2 = pMem2->r;
      }
      if( r1<r2 ) return -1;
      if( r1>r2 ) return 1;
      return 0;
    }else{
      assert( f1&MEM_Int );
      assert( f2&MEM_Int );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return 1;
      return 0;
    }
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc );
    assert( pMem1->enc==SQLITE_UTF8 || 
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      if( pMem1->enc==pColl->enc ){
        /* The strings are already in the correct encoding.  Call the
        ** comparison function directly */
        return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
      }else{
        const void *v1, *v2;
        int n1, n2;
        Mem c1;
        Mem c2;
        memset(&c1, 0, sizeof(c1));
        memset(&c2, 0, sizeof(c2));
        sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
        sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
        v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
        n1 = v1==0 ? 0 : c1.n;
        v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
        n2 = v2==0 ? 0 : c2.n;
        rc = pColl->xCmp(pColl->pUser, n1, v1, n2, v2);
        sqlite3VdbeMemRelease(&c1);
        sqlite3VdbeMemRelease(&c2);
        return rc;
      }
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }
 
  /* Both values must be blobs.  Compare using memcmp().  */
  rc = memcmp(pMem1->z, pMem2->z, (pMem1->n>pMem2->n)?pMem2->n:pMem1->n);
  if( rc==0 ){
    rc = pMem1->n - pMem2->n;
  }
  return rc;
}